

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence.hpp
# Opt level: O0

void __thiscall
boost::xpressive::detail::sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
sequence<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>>,mpl_::bool_<false>>>
          (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>_>,_mpl_::bool_<false>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *xpr)

{
  width wVar1;
  dynamic_xpression<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>_>,_mpl_::bool_<false>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pdVar2;
  intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>_>,_mpl_::bool_<false>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RSI;
  simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>_>,_mpl_::bool_<false>_>
  *in_RDI;
  _WordT *this_00;
  intrusive_ptr<const_boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffd0;
  intrusive_ptr<const_boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_18;
  intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>_>,_mpl_::bool_<false>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_10;
  
  *(undefined1 *)
   &(in_RDI->xpr_).
    super_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
    .charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL> = 1
  ;
  local_10 = in_RSI;
  intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>_>,_mpl_::bool_<false>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator->(in_RSI);
  wVar1 = simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>_>,_mpl_::bool_<false>_>
          ::get_width(in_RDI);
  *(size_t *)
   ((long)&(in_RDI->xpr_).
           super_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
           .charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
           super__Base_bitset<4UL> + 8) = wVar1.value_;
  *(undefined4 *)
   ((long)&(in_RDI->xpr_).
           super_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
           .charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
           super__Base_bitset<4UL> + 0x10) = 2;
  this_00 = (_WordT *)
            ((long)&(in_RDI->xpr_).
                    super_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
                    .charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                    super__Base_bitset<4UL> + 0x18);
  intrusive_ptr<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>const>
  ::
  intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>>,mpl_::bool_<false>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
            (&local_18,local_10);
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::shared_matchable((shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_00,(matchable_ptr *)in_RDI);
  intrusive_ptr<const_boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~intrusive_ptr(in_stack_ffffffffffffffd0);
  pdVar2 = intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>_>,_mpl_::bool_<false>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator->(local_10);
  *(shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)&(in_RDI->xpr_).
        super_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
        .charset_.complement_ = &pdVar2->next_;
  intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::intrusive_ptr((intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&(in_RDI->xpr_).
                      super_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
                      .charset_.posix_no_);
  *(pointer *)
   ((long)&(in_RDI->xpr_).
           super_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
           .charset_.posix_no_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  return;
}

Assistant:

sequence(intrusive_ptr<dynamic_xpression<Matcher, BidiIter> > const &xpr)
      : pure_(Matcher::pure)
      , width_(xpr->Matcher::get_width())
      , quant_(static_cast<quant_enum>(Matcher::quant))
      , head_(xpr)
      , tail_(&xpr->next_)
      , alt_end_xpr_()
      , alternates_(0)
    {
    }